

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deliminator.cpp
# Opt level: O1

bool __thiscall duckdb::Deliminator::HasSelection(Deliminator *this,LogicalOperator *op)

{
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *puVar1;
  bool bVar2;
  LogicalGet *pLVar3;
  pointer pTVar4;
  _Rb_tree_node_base *p_Var5;
  type pLVar6;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *this_00;
  bool bVar7;
  
  bVar7 = true;
  if (op->type != LOGICAL_FILTER) {
    if (op->type == LOGICAL_GET) {
      pLVar3 = LogicalOperator::Cast<duckdb::LogicalGet>(op);
      for (p_Var5 = (pLVar3->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          bVar7 = (_Rb_tree_header *)p_Var5 !=
                  &(pLVar3->table_filters).filters._M_t._M_impl.super__Rb_tree_header, bVar7;
          p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5)) {
        pTVar4 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                             *)&p_Var5[1]._M_parent);
        if (pTVar4->filter_type != IS_NOT_NULL) {
          if (bVar7) {
            return true;
          }
          break;
        }
      }
    }
    this_00 = (op->children).
              super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (op->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = this_00 != puVar1;
    if (bVar7) {
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(this_00);
      bVar2 = HasSelection(this,pLVar6);
      while (!bVar2) {
        this_00 = this_00 + 1;
        bVar7 = this_00 != puVar1;
        if (this_00 == puVar1) {
          return bVar7;
        }
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(this_00);
        bVar2 = HasSelection(this,pLVar6);
      }
    }
  }
  return bVar7;
}

Assistant:

bool Deliminator::HasSelection(const LogicalOperator &op) {
	// TODO once we implement selectivity estimation using samples we need to use that here
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_GET: {
		auto &get = op.Cast<LogicalGet>();
		for (const auto &filter : get.table_filters.filters) {
			if (filter.second->filter_type != TableFilterType::IS_NOT_NULL) {
				return true;
			}
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_FILTER:
		return true;
	default:
		break;
	}

	for (auto &child : op.children) {
		if (HasSelection(*child)) {
			return true;
		}
	}

	return false;
}